

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_palette.c
# Opt level: O3

bool_t prf_color_palette_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  ushort uVar1;
  uint8_t *buffer;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  prf_color_name_data *cdata;
  ushort *puVar6;
  
  if (node->opcode != prf_color_palette_info.opcode) {
    prf_error(3,"tried color palette save method on other node");
    return 0;
  }
  bf_put_uint16_be(bfile,node->opcode);
  bf_put_uint16_be(bfile,node->length);
  uVar5 = 4;
  if (node->length < 0x84) goto LAB_00105335;
  buffer = node->data;
  bf_write(bfile,buffer,0x80);
  uVar1 = node->length;
  uVar5 = 0x400;
  if (uVar1 < 0x1088) {
    uVar2 = uVar1 - 0x84;
    if ((short)(uVar1 - 0x84) < 0) {
      uVar2 = uVar1 - 0x81;
    }
    uVar5 = 0x84;
    if (6 < (ushort)(uVar1 - 0x81)) {
      uVar5 = (int)(short)uVar2 >> 2;
      goto LAB_0010523c;
    }
  }
  else {
LAB_0010523c:
    uVar4 = 0;
    do {
      bf_put_uint32_be(bfile,*(uint32_t *)(buffer + uVar4 * 4 + 0x80));
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
    uVar5 = uVar5 * 4 + 0x84;
    uVar1 = node->length;
  }
  uVar3 = uVar5 + 4;
  if ((uVar3 <= uVar1) &&
     (bf_put_uint32_be(bfile,*(uint32_t *)(buffer + 0x1080)), uVar5 = uVar3,
     *(int *)(buffer + 0x1080) != 0)) {
    puVar6 = (ushort *)(node->data + ((ulong)uVar3 - 4));
    uVar3 = 0;
    do {
      if ((uint)node->length < uVar5 + *puVar6) break;
      bf_put_uint16_be(bfile,*puVar6);
      bf_put_uint16_be(bfile,puVar6[1]);
      bf_put_uint16_be(bfile,puVar6[2]);
      bf_put_uint16_be(bfile,puVar6[3]);
      bf_write(bfile,(uint8_t *)(puVar6 + 4),*puVar6 - 8);
      uVar5 = uVar5 + *puVar6;
      puVar6 = (ushort *)((long)puVar6 + (ulong)*puVar6);
      uVar3 = uVar3 + 1;
    } while (uVar3 < *(uint *)(buffer + 0x1080));
  }
LAB_00105335:
  uVar3 = node->length - uVar5;
  if (uVar3 != 0 && (int)uVar5 <= (int)(uint)node->length) {
    bf_write(bfile,node->data + (long)(int)uVar5 + -4,uVar3);
  }
  return 1;
}

Assistant:

static
bool_t
prf_color_palette_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_color_palette_info.opcode ) {
        prf_error( 3, "tried color palette save method on other node" );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        unsigned int num, i;
        uint8_t * ptr;
        if ( node->length < (pos + 128) ) break;
        data = (node_data *) node->data;
        bf_write( bfile, (uint8_t *) data->reserved1, 128 ); pos += 128;
        num = PRF_MIN( 1024, ((node->length - 132) / 4) );
        for ( i = 0; i < num; i++ ) {
            bf_put_uint32_be( bfile, data->brightest_rgb[i] ); pos += 4;
        }
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->num_color_names ); pos += 4;
        ptr = node->data + pos - 4;

        for ( i = 0; i < data->num_color_names; i++ ) {
            struct prf_color_name_data * cdata;
            cdata = (struct prf_color_name_data *) ptr;
            if ( node->length < (pos + cdata->length) ) break;
            bf_put_uint16_be( bfile, cdata->length );
            bf_put_uint16_be( bfile, cdata->reserved1 );
            bf_put_uint16_be( bfile, cdata->index );
            bf_put_uint16_be( bfile, cdata->reserved2 );
            bf_write( bfile, (uint8_t *) cdata->name, cdata->length - 8 );
            pos += cdata->length;
            ptr += cdata->length;
        }

    } while ( FALSE );

    if ( pos < node->length )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}